

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

token_t copy_token(c2m_ctx_t c2m_ctx,token_t t,pos_t pos)

{
  token_t ptVar1;
  node_t_conflict pnVar2;
  
  ptVar1 = new_token(c2m_ctx,pos,t->repr,(int)*(short *)t,t->node_code);
  if (t->node != (node_t_conflict)0x0) {
    pnVar2 = copy_node_with_pos(c2m_ctx,t->node,pos);
    ptVar1->node = pnVar2;
  }
  return ptVar1;
}

Assistant:

static token_t copy_token (c2m_ctx_t c2m_ctx, token_t t, pos_t pos) {
  token_t token = new_token (c2m_ctx, pos, t->repr, t->code, t->node_code);

  if (t->node != NULL) token->node = copy_node_with_pos (c2m_ctx, t->node, pos);
  return token;
}